

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::ArrayQueryFunction::checkArguments
          (ArrayQueryFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  bitwidth_t bVar3;
  Type *pTVar4;
  Diagnostic *pDVar5;
  int32_t knownIndex;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,1,2);
  if (!bVar2) {
LAB_0035cf69:
    return pCVar1->errorType;
  }
  pTVar4 = ((*args->_M_ptr)->type).ptr;
  bVar2 = Type::isIntegral(pTVar4);
  if ((!bVar2) && (bVar2 = Type::isUnpackedArray(pTVar4), !bVar2)) {
    if (pTVar4->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar4);
    }
    if ((pTVar4->canonical->super_Symbol).kind != StringType) goto LAB_0035cf10;
  }
  if (pTVar4->canonical == (Type *)0x0) {
    Type::resolveCanonical(pTVar4);
  }
  if ((pTVar4->canonical->super_Symbol).kind == ScalarType) {
LAB_0035cf10:
    pTVar4 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,*args->_M_ptr);
    return pTVar4;
  }
  bVar2 = Type::hasFixedRange(pTVar4);
  if ((!bVar2) && ((*args->_M_ptr)->kind == DataType)) {
    pDVar5 = ASTContext::addDiag(context,(DiagCode)0x21000b,(*args->_M_ptr)->sourceRange);
    Diagnostic::operator<<(pDVar5,&(this->super_SystemSubroutine).name);
    goto LAB_0035cf69;
  }
  knownIndex = 0;
  if ((args->_M_extent)._M_extent_value < 2) {
    knownIndex = 1;
  }
  else {
    bVar2 = Type::isIntegral((args->_M_ptr[1]->type).ptr);
    if (!bVar2) {
      pTVar4 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,args->_M_ptr[1]);
      return pTVar4;
    }
    if ((((context->flags).m_bits & 2) == 0) && (bVar2 = checkDim(context,args,&knownIndex), !bVar2)
       ) goto LAB_0035cf69;
  }
  if (pTVar4->canonical == (Type *)0x0) {
    Type::resolveCanonical(pTVar4);
  }
  if ((pTVar4->canonical->super_Symbol).kind != AssociativeArrayType) goto LAB_0035d076;
  pTVar4 = Type::getAssociativeIndexType(pTVar4);
  if ((knownIndex == 0) || ((pTVar4 != (Type *)0x0 && (bVar2 = Type::isIntegral(pTVar4), bVar2)))) {
    if (knownIndex != 0) goto LAB_0035d06c;
    bVar3 = Type::getBitWidth(pTVar4);
    bVar2 = bVar3 < 0x21;
  }
  else {
    pDVar5 = ASTContext::addDiag(context,(DiagCode)0x20000b,(*args->_M_ptr)->sourceRange);
    Diagnostic::operator<<(pDVar5,&(this->super_SystemSubroutine).name);
    pTVar4 = pCVar1->errorType;
LAB_0035d06c:
    bVar2 = false;
  }
  if (!bVar2) {
    return pTVar4;
  }
LAB_0035d076:
  return pCVar1->integerType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 2))
            return comp.getErrorType();

        auto& type = *args[0]->type;
        if ((!type.isIntegral() && !type.isUnpackedArray() && !type.isString()) || type.isScalar())
            return badArg(context, *args[0]);

        // Spec says we have to disallow this case.
        if (!type.hasFixedRange() && args[0]->kind == ExpressionKind::DataType) {
            context.addDiag(diag::QueryOnDynamicType, args[0]->sourceRange) << name;
            return comp.getErrorType();
        }

        int32_t knownIndex = 0;
        if (args.size() > 1) {
            if (!args[1]->type->isIntegral())
                return badArg(context, *args[1]);

            // Try to verify the dimension index if it's a constant.
            if (!context.inUnevaluatedBranch() && !checkDim(context, args, knownIndex))
                return comp.getErrorType();
        }
        else {
            // Index defaults to 1 if not provided.
            knownIndex = 1;
        }

        if (type.isAssociativeArray()) {
            // If the first argument is an associative array and we know we're selecting it,
            // ensure that the index type is integral.
            auto indexType = type.getAssociativeIndexType();
            if (knownIndex && (!indexType || !indexType->isIntegral())) {
                context.addDiag(diag::QueryOnAssociativeWildcard, args[0]->sourceRange) << name;
                return comp.getErrorType();
            }

            // If the index is known, the result type is the index type.
            if (knownIndex)
                return *indexType;

            // If the index is unknown, we don't know if they will select the associative array
            // or some other dimension. Use the index type if it's larger than a normal integer,
            // and otherwise just use an integer result type.
            if (indexType->getBitWidth() > 32)
                return *indexType;
        }

        return comp.getIntegerType();
    }